

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestWithCustomGenerator.cpp
# Opt level: O2

vector<Rectangle,_std::allocator<Rectangle>_> * __thiscall
CustomGenerator::shrink
          (vector<Rectangle,_std::allocator<Rectangle>_> *__return_storage_ptr__,
          CustomGenerator *this,Rectangle *r)

{
  Rectangle local_18;
  
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Rectangle,_std::allocator<Rectangle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < r->width) {
    local_18.height = r->height;
    local_18.width = r->width + -1;
    std::vector<Rectangle,_std::allocator<Rectangle>_>::emplace_back<Rectangle>
              (__return_storage_ptr__,&local_18);
  }
  if (1 < r->height) {
    local_18.height = r->height + -1;
    local_18.width = r->width;
    std::vector<Rectangle,_std::allocator<Rectangle>_>::emplace_back<Rectangle>
              (__return_storage_ptr__,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Rectangle> shrink(const Rectangle& r) {
    std::vector<Rectangle> ret;
    if (r.getWidth() > 1)
      ret.push_back(Rectangle(r.getWidth() - 1, r.getHeight()));
    if (r.getHeight() > 1) {
      ret.push_back(Rectangle(r.getWidth(), r.getHeight() - 1));
    }
    return ret;
  }